

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_1>
          (xr_reader *this,xr_reader *container)

{
  reference _slot;
  value_type local_38;
  uint32_t local_2c;
  xr_reader *pxStack_28;
  uint32_t id;
  xr_reader *s;
  vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_> *container_local;
  xr_reader *this_local;
  
  local_2c = 0;
  s = container;
  container_local = (vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_> *)this;
  while( true ) {
    pxStack_28 = open_chunk(this,local_2c);
    if (pxStack_28 == (xr_reader *)0x0) break;
    local_38 = (value_type)0x0;
    std::vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>::push_back
              ((vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_> *)s,&local_38)
    ;
    _slot = std::vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>::back
                      ((vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_> *)s);
    read_slot_1::operator()((read_slot_1 *)((long)&this_local + 7),_slot,pxStack_28);
    close_chunk(this,&stack0xffffffffffffffd8);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

inline void xr_reader::r_chunks(T& container, F read)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = open_chunk(id)); ++id) {
		container.push_back(typename T::value_type());
		read(container.back(), *s);
		close_chunk(s);
	}
}